

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O2

void hexdumpgroups<unsigned_char_const*>
               (string *str,uchar *buf,size_t nLength,int groupsize,char sep)

{
  int iVar1;
  char *p;
  size_t sVar2;
  
  std::__cxx11::string::resize((ulong)str);
  p = (str->_M_dataplus)._M_p + str->_M_string_length + nLength * -3;
  iVar1 = 0;
  for (sVar2 = 0; nLength != sVar2; sVar2 = sVar2 + 1) {
    byte2hexchars(buf[sVar2],p);
    if (iVar1 == groupsize + -1) {
      p[2] = sep;
      p = p + 3;
      iVar1 = 0;
    }
    else {
      p = p + 2;
      iVar1 = iVar1 + 1;
    }
  }
  return;
}

Assistant:

void hexdumpgroups(std::string &str, I buf, size_t nLength, int groupsize, char sep=' ')
{
    str.resize(str.size()+nLength*3);
    char *p= &str[str.size()-nLength*3];
    int i= 0;
    while(nLength--)
    {
        byte2hexchars(get8(buf), p); p+=2; buf++;

        if (i++ == groupsize-1) {
            *p++ = sep;
            i= 0;
        }
    }
}